

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O0

void __thiscall
RecoveryTest_AccessViolationTest_Test::TestBody(RecoveryTest_AccessViolationTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  AssertHelper local_118;
  Message local_110;
  int local_104;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> local_c8;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *local_b0;
  DeathTest *gtest_dt;
  RE *local_18;
  RE *gtest_regex;
  RecoveryTest_AccessViolationTest_Test *this_local;
  
  gtest_regex = (RE *)this;
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_001114d3;
  testing::internal::RE::RE((RE *)&gtest_dt,"AccessViolationTest");
  local_18 = (RE *)&gtest_dt;
  bVar2 = testing::internal::DeathTest::Create
                    ("AccessViolation()",(RE *)&gtest_dt,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                     ,0x36,&local_b0);
  if (bVar2) {
    if (local_b0 != (DeathTest *)0x0) {
      testing::internal::scoped_ptr<testing::internal::DeathTest>::scoped_ptr(&local_c8,local_b0);
      iVar3 = (*local_b0->_vptr_DeathTest[2])();
      pDVar1 = local_b0;
      if (iVar3 == 0) {
        extensions::ExitedOrKilled::ExitedOrKilled((ExitedOrKilled *)&gtest_sentinel,3,0xb);
        iVar3 = (*local_b0->_vptr_DeathTest[3])();
        bVar2 = extensions::ExitedOrKilled::operator()((ExitedOrKilled *)&gtest_sentinel,iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_00111465;
        local_104 = 2;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_b0);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            AccessViolation();
          }
          (*local_b0->_vptr_DeathTest[5])(local_b0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_00111465:
        local_104 = 0;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&local_c8);
      if (local_104 != 0) goto LAB_001114a1;
    }
    local_104 = 0;
  }
  else {
    local_104 = 2;
  }
LAB_001114a1:
  testing::internal::RE::~RE((RE *)&gtest_dt);
  if (local_104 == 0) {
    return;
  }
LAB_001114d3:
  testing::Message::Message(&local_110);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_118,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x36,message);
  testing::internal::AssertHelper::operator=(&local_118,&local_110);
  testing::internal::AssertHelper::~AssertHelper(&local_118);
  testing::Message::~Message(&local_110);
  return;
}

Assistant:

TEST_F (RecoveryTest, AccessViolationTest) {
    ASSERT_EXIT(AccessViolation(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGSEGV), "AccessViolationTest");
}